

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

mxx * __thiscall
mxx::file_block_decompose_abi_cxx11_(mxx *this,char *filename,MPI_Comm comm,size_t max_local_size)

{
  unsigned_long size;
  unsigned_long __off;
  streambuf *sbuf;
  stringstream local_478 [8];
  stringstream ss;
  undefined1 local_468 [376];
  streampos local_2f0;
  undefined1 local_2e0 [8];
  rangebuf rb;
  ifstream t;
  size_t offset;
  size_t local_size;
  block_decomposition<unsigned_long> part;
  int rank;
  int p;
  ulong local_30;
  size_t file_size;
  size_t max_local_size_local;
  MPI_Comm comm_local;
  char *filename_local;
  string *local_str;
  
  file_size = max_local_size;
  max_local_size_local = (size_t)comm;
  comm_local = (MPI_Comm)filename;
  filename_local = (char *)this;
  _rank = get_filesize(filename);
  local_30 = std::fpos::operator_cast_to_long((fpos *)&rank);
  MPI_Comm_size(max_local_size_local,&part.rank);
  MPI_Comm_rank(max_local_size_local,&part.p);
  if ((file_size != 0) && (file_size < local_30 / (ulong)(long)part.rank)) {
    local_30 = (long)part.rank * file_size;
  }
  partition::block_decomposition<unsigned_long>::block_decomposition
            ((block_decomposition<unsigned_long> *)&local_size,local_30,part.rank,part.p);
  size = partition::block_decomposition<unsigned_long>::local_size
                   ((block_decomposition<unsigned_long> *)&local_size);
  __off = partition::block_decomposition<unsigned_long>::excl_prefix_size
                    ((block_decomposition<unsigned_long> *)&local_size);
  std::ifstream::ifstream(&rb.buf_,(char *)comm_local,_S_in);
  std::fpos<__mbstate_t>::fpos(&local_2f0,__off);
  sbuf = (streambuf *)std::ifstream::rdbuf();
  rangebuf::rangebuf((rangebuf *)local_2e0,local_2f0,size,sbuf);
  std::__cxx11::stringstream::stringstream(local_478);
  std::ostream::operator<<(local_468,(streambuf *)local_2e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_478);
  rangebuf::~rangebuf((rangebuf *)local_2e0);
  std::ifstream::~ifstream(&rb.buf_);
  partition::block_decomposition<unsigned_long>::~block_decomposition
            ((block_decomposition<unsigned_long> *)&local_size);
  return this;
}

Assistant:

std::string file_block_decompose(const char* filename, MPI_Comm comm = MPI_COMM_WORLD, std::size_t max_local_size = 0)
{
    // TODO: handle error if file doesn't exist

    // get size of input file
    std::size_t file_size = get_filesize(filename);

    // get communication parameters
    int p, rank;
    MPI_Comm_size(comm, &p);
    MPI_Comm_rank(comm, &rank);

    // restrict max local size (assuming that it is the same parameter on each
    // processor)
    if (max_local_size > 0 && file_size / p > max_local_size)
        file_size = p*max_local_size;
    partition::block_decomposition<std::size_t> part(file_size, p, rank);
    // block decompose
    std::size_t local_size = part.local_size();
    std::size_t offset = part.excl_prefix_size();

    // open file
    std::ifstream t(filename);
    // wrap in our custom range buffer (of type std::streambuf)
    rangebuf rb(offset, local_size, t.rdbuf());

    // read file (range) buffer into string stream
    std::stringstream ss;
    ss << &rb;

    std::string local_str(ss.str());

    return local_str;
}